

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void pnga_alloc_gatscat_buf(Integer nelems)

{
  char *name;
  undefined8 in_RDI;
  Integer unaff_retaddr;
  Integer nprocs;
  Integer in_stack_00000188;
  char *in_stack_00000190;
  int type;
  
  name = (char *)pnga_nnodes();
  if (GA_prealloc_gatscat != 0) {
    pnga_error(in_stack_00000190,in_stack_00000188);
  }
  GA_prealloc_gatscat = (int)in_RDI;
  GA_header = (Integer *)pnga_malloc(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),name);
  type = (int)((ulong)in_RDI >> 0x20);
  GA_list = (Integer *)pnga_malloc(unaff_retaddr,type,name);
  GA_elems = (Integer *)pnga_malloc(unaff_retaddr,type,name);
  return;
}

Assistant:

void pnga_alloc_gatscat_buf(Integer nelems)
{
  Integer nprocs = pnga_nnodes();
  if (GA_prealloc_gatscat)
    pnga_error("Gather/scatter buffers already allocated",nelems);
  GA_prealloc_gatscat = nelems;
  GA_header =(Integer *)pnga_malloc(nprocs, MT_F_INT, "ga_gat_header");
  GA_list =(Integer *)pnga_malloc(nelems, MT_F_INT, "ga_gat_list");
  GA_elems =(Integer *)pnga_malloc(nprocs, MT_F_INT, "ga_gat_nelems");
}